

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadCompressedPaths(CrateReader *this,uint64_t maxNumPaths)

{
  uint64_t uVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ostream *poVar6;
  _Bit_type *p_Var7;
  size_t __n;
  ulong uVar8;
  _Bit_type *p_Var9;
  _Bit_type *p_Var10;
  size_type __new_size;
  vector<int,_std::allocator<int>_> *elementTokenIndexes_00;
  int iVar11;
  char *pcVar12;
  string *err;
  size_t i_1;
  size_t i;
  pointer pcVar13;
  size_t i_2;
  reference rVar14;
  uint64_t numEncodedPaths;
  size_t sumDecodedPaths;
  vector<bool,_std::allocator<bool>_> visit_table;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pathIndexes;
  vector<char,_std::allocator<char>_> compBuffer;
  uint64_t compJumpsSize;
  vector<int,_std::allocator<int>_> jumps;
  vector<int,_std::allocator<int>_> elementTokenIndexes;
  vector<char,_std::allocator<char>_> workingSpace;
  ostringstream ss_e;
  BuildDecompressedPathsArg arg;
  allocator local_3a1;
  pointer local_3a0;
  undefined1 local_398 [8];
  _Bvector_base<std::allocator<bool>_> local_390;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_368;
  _Vector_base<char,_std::allocator<char>_> local_350;
  string local_338;
  _Vector_base<int,_std::allocator<int>_> local_318;
  _Vector_base<int,_std::allocator<int>_> local_2f8;
  _Vector_base<char,_std::allocator<char>_> local_2e0;
  Path local_2c8;
  undefined1 local_150 [16];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_140;
  size_t local_128;
  Path local_120;
  string local_50 [32];
  
  local_368._M_impl.super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_start = (int32_t *)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318._M_impl.super__Vector_impl_data._M_start = (int32_t *)0x0;
  local_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = StreamReader::read8(this->_sr,(uint64_t *)&local_3a0);
  if ((bVar3) && (local_3a0 <= maxNumPaths)) {
    uVar5 = (long)local_3a0 * 0xc + this->_memoryUsage;
    this->_memoryUsage = uVar5;
    if ((this->_config).maxMemoryBudget < uVar5) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
      poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,"[Crate]");
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
      poVar6 = ::std::operator<<(poVar6,"():");
      iVar11 = 0x1455;
    }
    else {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_368,
                 (size_type)local_3a0);
      ::std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&local_2f8,(size_type)local_3a0);
      ::std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&local_318,(size_type)local_3a0);
      p_Var7 = (_Bit_type *)Usd_IntegerCompression::GetCompressedBufferSize((size_t)local_3a0);
      __n = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize((size_t)local_3a0);
      uVar8 = this->_memoryUsage + (long)p_Var7;
      this->_memoryUsage = uVar8;
      uVar5 = (this->_config).maxMemoryBudget;
      if (uVar5 < uVar8) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
        poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,"[Crate]");
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
        poVar6 = ::std::operator<<(poVar6,"():");
        iVar11 = 0x145d;
      }
      else {
        this->_memoryUsage = uVar8 + __n;
        if (uVar8 + __n <= uVar5) {
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&local_350,(size_type)p_Var7,
                     (allocator_type *)&local_2c8);
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&local_2e0,__n,
                     (allocator_type *)&local_2c8);
          bVar3 = StreamReader::read8(this->_sr,(uint64_t *)&local_390);
          p_Var10 = local_390._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                    _M_p;
          if (!bVar3) goto LAB_00183bf1;
          if (p_Var7 < local_390._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                       _M_p) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
            poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,"[Crate]");
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x146d);
            ::std::operator<<(poVar6," ");
            pcVar12 = "Invalid Compressed PathIndexes size.";
            goto LAB_00183ca9;
          }
          uVar1 = this->_memoryUsage;
          this->_memoryUsage =
               (long)local_390._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                     _M_p + uVar1;
          if ((pointer)(this->_config).maxMemoryBudget <
              (pointer)((long)local_390._M_impl.super__Bvector_impl_data._M_start.
                              super__Bit_iterator_base._M_p + uVar1)) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
            poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,"[Crate]");
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
            poVar6 = ::std::operator<<(poVar6,"():");
            iVar11 = 0x1470;
LAB_00183c8e:
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,iVar11);
            ::std::operator<<(poVar6," ");
            pcVar12 = "Reached to max memory budget.";
            goto LAB_00183ca9;
          }
          p_Var9 = (_Bit_type *)
                   StreamReader::read(this->_sr,
                                      (int)local_390._M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p,
                                      local_390._M_impl.super__Bvector_impl_data._M_start.
                                      super__Bit_iterator_base._M_p,
                                      (size_t)local_350._M_impl.super__Vector_impl_data._M_start);
          if (p_Var10 == p_Var9) {
            local_2c8._prim_part._M_dataplus._M_p = (pointer)&local_2c8._prim_part.field_2;
            local_2c8._prim_part._M_string_length = 0;
            local_2c8._prim_part.field_2._M_local_buf[0] = '\0';
            Usd_IntegerCompression::DecompressFromBuffer
                      (local_350._M_impl.super__Vector_impl_data._M_start,
                       (size_t)local_390._M_impl.super__Bvector_impl_data._M_start.
                               super__Bit_iterator_base._M_p,
                       local_368._M_impl.super__Vector_impl_data._M_start,(size_t)local_3a0,
                       (string *)&local_2c8,local_2e0._M_impl.super__Vector_impl_data._M_start);
            if (local_2c8._prim_part._M_string_length != 0) {
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_150,"Failed to decode pathIndexes\n",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_2c8);
              ::std::__cxx11::string::append((string *)&this->_err);
              ::std::__cxx11::string::_M_dispose();
LAB_00183dbf:
              ::std::__cxx11::string::_M_dispose();
              goto LAB_00183cfa;
            }
            ::std::__cxx11::string::_M_dispose();
            bVar3 = StreamReader::read8(this->_sr,(uint64_t *)&local_338);
            _Var2._M_p = local_338._M_dataplus._M_p;
            if (!bVar3) goto LAB_00183bf1;
            if (p_Var7 < local_338._M_dataplus._M_p) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,"[Crate]");
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
              poVar6 = ::std::operator<<(poVar6,"():");
              iVar11 = 0x148f;
LAB_00183e88:
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,iVar11);
              ::std::operator<<(poVar6," ");
              pcVar12 = "Invalid Compressed elementTokenIndexes size.";
LAB_00183ca9:
              poVar6 = ::std::operator<<((ostream *)&local_2c8,pcVar12);
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)&this->_err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c8);
              goto LAB_00183cfa;
            }
            uVar1 = this->_memoryUsage;
            this->_memoryUsage = (uint64_t)(local_338._M_dataplus._M_p + uVar1);
            if ((pointer)(this->_config).maxMemoryBudget < local_338._M_dataplus._M_p + uVar1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,"[Crate]");
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
              poVar6 = ::std::operator<<(poVar6,"():");
              iVar11 = 0x1492;
              goto LAB_00183c8e;
            }
            p_Var10 = (_Bit_type *)
                      StreamReader::read(this->_sr,(int)local_338._M_dataplus._M_p,
                                         local_338._M_dataplus._M_p,
                                         (size_t)local_350._M_impl.super__Vector_impl_data._M_start)
            ;
            if ((_Bit_type *)_Var2._M_p != p_Var10) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1498);
              ::std::operator<<(poVar6," ");
              pcVar12 = "Failed to read elementTokenIndexes data.";
              goto LAB_00183ca9;
            }
            local_150._0_8_ = &local_140;
            local_150._8_8_ = (_Vector_base<int,_std::allocator<int>_> *)0x0;
            local_140._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_140._M_impl.super__Vector_impl_data._M_start &
                          0xffffffffffffff00);
            Usd_IntegerCompression::DecompressFromBuffer
                      (local_350._M_impl.super__Vector_impl_data._M_start,
                       (size_t)local_338._M_dataplus._M_p,
                       local_2f8._M_impl.super__Vector_impl_data._M_start,(size_t)local_3a0,
                       (string *)local_150,local_2e0._M_impl.super__Vector_impl_data._M_start);
            if ((_Vector_base<int,_std::allocator<int>_> *)local_150._8_8_ !=
                (_Vector_base<int,_std::allocator<int>_> *)0x0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x14a3);
              ::std::operator<<(poVar6," ");
              pcVar12 = "Failed to decode elementTokenIndexes.";
LAB_0018403b:
              poVar6 = ::std::operator<<((ostream *)&local_2c8,pcVar12);
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)&this->_err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c8);
              goto LAB_00183dbf;
            }
            ::std::__cxx11::string::_M_dispose();
            bVar3 = StreamReader::read8(this->_sr,(uint64_t *)&local_338);
            _Var2._M_p = local_338._M_dataplus._M_p;
            if (!bVar3) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x14ac);
              ::std::operator<<(poVar6," ");
              pcVar12 = "Failed to read compressed jumpsSize.";
              goto LAB_00183ca9;
            }
            if (p_Var7 < local_338._M_dataplus._M_p) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,"[Crate]");
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
              poVar6 = ::std::operator<<(poVar6,"():");
              iVar11 = 0x14b1;
              goto LAB_00183e88;
            }
            uVar1 = this->_memoryUsage;
            this->_memoryUsage = (uint64_t)(local_338._M_dataplus._M_p + uVar1);
            if ((pointer)(this->_config).maxMemoryBudget < local_338._M_dataplus._M_p + uVar1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,"[Crate]");
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
              poVar6 = ::std::operator<<(poVar6,"():");
              iVar11 = 0x14b4;
              goto LAB_00183c8e;
            }
            p_Var7 = (_Bit_type *)
                     StreamReader::read(this->_sr,(int)local_338._M_dataplus._M_p,
                                        local_338._M_dataplus._M_p,
                                        (size_t)local_350._M_impl.super__Vector_impl_data._M_start);
            if ((_Bit_type *)_Var2._M_p != p_Var7) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x14b9);
              ::std::operator<<(poVar6," ");
              pcVar12 = "Failed to read compressed jumps data.";
              goto LAB_00183ca9;
            }
            err = (string *)local_150;
            local_150._0_8_ = &local_140;
            local_150._8_8_ = (_Vector_base<int,_std::allocator<int>_> *)0x0;
            local_140._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_140._M_impl.super__Vector_impl_data._M_start &
                          0xffffffffffffff00);
            Usd_IntegerCompression::DecompressFromBuffer
                      (local_350._M_impl.super__Vector_impl_data._M_start,
                       (size_t)local_338._M_dataplus._M_p,
                       local_318._M_impl.super__Vector_impl_data._M_start,(size_t)local_3a0,err,
                       local_2e0._M_impl.super__Vector_impl_data._M_start);
            if ((_Vector_base<int,_std::allocator<int>_> *)local_150._8_8_ !=
                (_Vector_base<int,_std::allocator<int>_> *)0x0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x14c3);
              ::std::operator<<(poVar6," ");
              pcVar12 = "Failed to decode jumps.";
              goto LAB_0018403b;
            }
            ::std::__cxx11::string::_M_dispose();
            local_390._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                 (_Bit_type *)0x0;
            local_390._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
                 0;
            local_390._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
                 (_Bit_type *)0x0;
            local_390._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                 = 0;
            local_390._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            __new_size = ((long)(this->_paths).
                                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->_paths).
                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0xd0;
            uVar5 = this->_memoryUsage + __new_size;
            this->_memoryUsage = uVar5;
            if ((this->_config).maxMemoryBudget < uVar5) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,"[Crate]");
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x14e3);
              ::std::operator<<(poVar6," ");
              poVar6 = ::std::operator<<((ostream *)&local_2c8,"Reached to max memory budget.");
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)&this->_err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c8);
              bVar3 = false;
            }
            else {
              ::std::vector<bool,_std::allocator<bool>_>::resize
                        ((vector<bool,_std::allocator<bool>_> *)&local_390,__new_size,false);
              for (uVar5 = 0;
                  uVar5 < (ulong)local_390._M_impl.super__Bvector_impl_data._M_finish.
                                 super__Bit_iterator_base._M_offset +
                          ((long)local_390._M_impl.super__Bvector_impl_data._M_finish.
                                 super__Bit_iterator_base._M_p -
                          (long)local_390._M_impl.super__Bvector_impl_data._M_start.
                                super__Bit_iterator_base._M_p) * 8; uVar5 = uVar5 + 1) {
                rVar14 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)&local_390,uVar5);
                *rVar14._M_p = *rVar14._M_p & ~rVar14._M_mask;
              }
              BuildDecompressedPathsArg::BuildDecompressedPathsArg
                        ((BuildDecompressedPathsArg *)local_150);
              local_140._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_2c8._prop_part._M_dataplus._M_p = (pointer)&local_2c8._prop_part.field_2;
              local_2c8._prim_part._M_dataplus._M_p = (pointer)&local_2c8._prim_part.field_2;
              local_2c8._prim_part._M_string_length = 0;
              bVar3 = false;
              local_2c8._prim_part.field_2._M_local_buf[0] = '\0';
              local_2c8._prop_part._M_string_length = 0;
              local_2c8._prop_part.field_2._M_local_buf[0] = '\0';
              local_2c8._variant_part._M_dataplus._M_p = (pointer)&local_2c8._variant_part.field_2;
              local_2c8._variant_part._M_string_length = 0;
              local_2c8._variant_part.field_2._M_local_buf[0] = '\0';
              local_2c8._variant_selection_part._M_dataplus._M_p =
                   (pointer)&local_2c8._variant_selection_part.field_2;
              local_2c8._variant_selection_part._M_string_length = 0;
              local_2c8._variant_selection_part.field_2._M_local_buf[0] = '\0';
              local_2c8._variant_part_str._M_dataplus._M_p =
                   (pointer)&local_2c8._variant_part_str.field_2;
              local_2c8._variant_part_str._M_string_length = 0;
              local_2c8._variant_part_str.field_2._M_local_buf[0] = '\0';
              local_2c8._element._M_dataplus._M_p = (pointer)&local_2c8._element.field_2;
              local_2c8._element._M_string_length = 0;
              local_2c8._element.field_2._M_local_buf[0] = '\0';
              local_2c8._path_type.has_value_ = false;
              local_2c8._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
              local_128 = ((long)local_368._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_368._M_impl.super__Vector_impl_data._M_start >> 2) - 1;
              local_2c8._valid = false;
              local_150._0_8_ = &local_368;
              local_150._8_8_ = &local_2f8;
              local_140._M_impl.super__Vector_impl_data._M_start = (pointer)&local_318;
              local_140._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_390;
              Path::operator=(&local_120,&local_2c8);
              Path::~Path(&local_2c8);
              bVar4 = BuildDecompressedPathsImpl(this,(BuildDecompressedPathsArg *)local_150);
              if (bVar4) {
                local_398 = (undefined1  [8])0x0;
                pcVar13 = (pointer)0x0;
                for (uVar5 = 0;
                    elementTokenIndexes_00 =
                         (vector<int,_std::allocator<int>_> *)
                         (ulong)local_390._M_impl.super__Bvector_impl_data._M_finish.
                                super__Bit_iterator_base._M_offset,
                    uVar5 < (ulong)((long)elementTokenIndexes_00 +
                                   ((long)local_390._M_impl.super__Bvector_impl_data._M_finish.
                                          super__Bit_iterator_base._M_p -
                                   (long)local_390._M_impl.super__Bvector_impl_data._M_start.
                                         super__Bit_iterator_base._M_p) * 8); uVar5 = uVar5 + 1) {
                  rVar14 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)&local_390,uVar5);
                  if ((*rVar14._M_p & rVar14._M_mask) != 0) {
                    pcVar13 = pcVar13 + 1;
                    local_398 = (undefined1  [8])pcVar13;
                  }
                }
                if (pcVar13 == local_3a0) {
                  for (uVar5 = 0;
                      uVar5 < (ulong)((long)elementTokenIndexes_00 +
                                     ((long)local_390._M_impl.super__Bvector_impl_data._M_finish.
                                            super__Bit_iterator_base._M_p -
                                     (long)local_390._M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p) * 8); uVar5 = uVar5 + 1) {
                    rVar14 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                       ((vector<bool,_std::allocator<bool>_> *)&local_390,uVar5);
                    *rVar14._M_p = *rVar14._M_p & ~rVar14._M_mask;
                    elementTokenIndexes_00 =
                         (vector<int,_std::allocator<int>_> *)
                         (ulong)local_390._M_impl.super__Bvector_impl_data._M_finish.
                                super__Bit_iterator_base._M_offset;
                  }
                  bVar3 = false;
                  err = (string *)&local_390;
                  bVar4 = BuildNodeHierarchy(this,(
                                                  vector<unsigned_int,_std::allocator<unsigned_int>_>
                                                  *)&local_368,elementTokenIndexes_00,
                                             (vector<int,_std::allocator<int>_> *)&local_318,
                                             (vector<bool,_std::allocator<bool>_> *)err,0,-1);
                  if (bVar4) {
                    local_398 = (undefined1  [8])0x0;
                    for (uVar5 = 0;
                        uVar5 < (ulong)local_390._M_impl.super__Bvector_impl_data._M_finish.
                                       super__Bit_iterator_base._M_offset +
                                ((long)local_390._M_impl.super__Bvector_impl_data._M_finish.
                                       super__Bit_iterator_base._M_p -
                                (long)local_390._M_impl.super__Bvector_impl_data._M_start.
                                      super__Bit_iterator_base._M_p) * 8; uVar5 = uVar5 + 1) {
                      rVar14 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                         ((vector<bool,_std::allocator<bool>_> *)&local_390,uVar5);
                      if ((*rVar14._M_p & rVar14._M_mask) != 0) {
                        local_398 = (undefined1  [8])((long)local_398 + 1);
                      }
                    }
                    bVar3 = true;
                    if (local_398 != (undefined1  [8])local_3a0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
                      poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
                      poVar6 = ::std::operator<<(poVar6,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                                );
                      poVar6 = ::std::operator<<(poVar6,":");
                      poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
                      poVar6 = ::std::operator<<(poVar6,"():");
                      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1522);
                      ::std::operator<<(poVar6," ");
                      pcVar12 = 
                      "Decoded {} paths but numEncodedPaths in BuildNodeHierarchy is {}. Possible corruption of Crate data."
                      ;
                      goto LAB_001848e6;
                    }
                  }
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
                  poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
                  poVar6 = ::std::operator<<(poVar6,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                            );
                  poVar6 = ::std::operator<<(poVar6,":");
                  poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
                  poVar6 = ::std::operator<<(poVar6,"():");
                  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x150b);
                  ::std::operator<<(poVar6," ");
                  pcVar12 = 
                  "Decoded {} paths but numEncodedPaths in Crate is {}. Possible corruption of Crate data."
                  ;
LAB_001848e6:
                  ::std::__cxx11::string::string(local_50,pcVar12,&local_3a1);
                  fmt::format<unsigned_long,unsigned_long>
                            (&local_338,(fmt *)local_50,(string *)local_398,
                             (unsigned_long *)&local_3a0,(unsigned_long *)err);
                  poVar6 = ::std::operator<<((ostream *)&local_2c8,(string *)&local_338);
                  ::std::operator<<(poVar6,"\n");
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::string::append((string *)&this->_err);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c8);
                  bVar3 = false;
                }
              }
              Path::~Path(&local_120);
            }
            ::std::_Bvector_base<std::allocator<bool>_>::_M_deallocate(&local_390);
          }
          else {
LAB_00183bf1:
            ::std::__cxx11::string::append((char *)&this->_err);
LAB_00183cfa:
            bVar3 = false;
          }
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_2e0);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_350);
          goto LAB_00183ac4;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2c8);
        poVar6 = ::std::operator<<((ostream *)&local_2c8,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,"[Crate]");
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReadCompressedPaths");
        poVar6 = ::std::operator<<(poVar6,"():");
        iVar11 = 0x145e;
      }
    }
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,iVar11);
    ::std::operator<<(poVar6," ");
    poVar6 = ::std::operator<<((ostream *)&local_2c8,"Reached to max memory budget.");
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2c8);
  }
  else {
    ::std::__cxx11::string::append((char *)&this->_err);
  }
  bVar3 = false;
LAB_00183ac4:
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_318);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2f8);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_368);
  return bVar3;
}

Assistant:

bool CrateReader::ReadCompressedPaths(const uint64_t maxNumPaths) {
  std::vector<uint32_t> pathIndexes;
  std::vector<int32_t> elementTokenIndexes;
  std::vector<int32_t> jumps;

  // Read number of encoded paths.
  uint64_t numEncodedPaths;
  if (!_sr->read8(&numEncodedPaths)) {
    _err += "Failed to read the number of encoded paths.\n";
    return false;
  }

  DCOUT("maxNumPaths : " << maxNumPaths);
  DCOUT("numEncodedPaths : " << numEncodedPaths);

  // Number of compressed paths could be less than maxNumPaths,
  // but should not be greater.
  if (maxNumPaths < numEncodedPaths) {
    _err += "Size mismatch of numEncodedPaths at `PATHS` section.\n";
    return false;
  }


  // 3 = pathIndex, elementTokenIndex, jump
  CHECK_MEMORY_USAGE(size_t(numEncodedPaths) * sizeof(int32_t) * 3);

  pathIndexes.resize(static_cast<size_t>(numEncodedPaths));
  elementTokenIndexes.resize(static_cast<size_t>(numEncodedPaths));
  jumps.resize(static_cast<size_t>(numEncodedPaths));

  size_t compBufferSize = Usd_IntegerCompression::GetCompressedBufferSize(static_cast<size_t>(numEncodedPaths));
  size_t workspaceBufferSize = Usd_IntegerCompression::GetDecompressionWorkingSpaceSize(static_cast<size_t>(numEncodedPaths));
  CHECK_MEMORY_USAGE(compBufferSize);
  CHECK_MEMORY_USAGE(workspaceBufferSize);

  // Create temporary space for decompressing.
  std::vector<char> compBuffer(compBufferSize);
  std::vector<char> workingSpace(workspaceBufferSize);

  // pathIndexes.
  {
    uint64_t compPathIndexesSize;
    if (!_sr->read8(&compPathIndexesSize)) {
      _err += "Failed to read pathIndexesSize.\n";
      return false;
    }

    if (compPathIndexesSize > compBufferSize) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Compressed PathIndexes size.");
    }

    CHECK_MEMORY_USAGE(size_t(compPathIndexesSize));

    if (compPathIndexesSize !=
        _sr->read(size_t(compPathIndexesSize), size_t(compPathIndexesSize),
                  reinterpret_cast<uint8_t *>(compBuffer.data()))) {
      _err += "Failed to read compressed pathIndexes data.\n";
      return false;
    }

    DCOUT("comBuffer.size = " << compBuffer.size());
    DCOUT("compPathIndexesSize = " << compPathIndexesSize);

    std::string err;
    Usd_IntegerCompression::DecompressFromBuffer(
        compBuffer.data(), size_t(compPathIndexesSize), pathIndexes.data(),
        size_t(numEncodedPaths), &err, workingSpace.data());
    if (!err.empty()) {
      _err += "Failed to decode pathIndexes\n" + err;
      return false;
    }
  }

  // elementTokenIndexes.
  {
    uint64_t compElementTokenIndexesSize;
    if (!_sr->read8(&compElementTokenIndexesSize)) {
      _err += "Failed to read elementTokenIndexesSize.\n";
      return false;
    }

    if (compElementTokenIndexesSize > compBufferSize) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Compressed elementTokenIndexes size.");
    }

    CHECK_MEMORY_USAGE(size_t(compElementTokenIndexesSize));

    if (compElementTokenIndexesSize !=
        _sr->read(size_t(compElementTokenIndexesSize),
                  size_t(compElementTokenIndexesSize),
                  reinterpret_cast<uint8_t *>(compBuffer.data()))) {
      PUSH_ERROR("Failed to read elementTokenIndexes data.");
      return false;
    }

    std::string err;
    Usd_IntegerCompression::DecompressFromBuffer(
        compBuffer.data(), size_t(compElementTokenIndexesSize),
        elementTokenIndexes.data(), size_t(numEncodedPaths), &err,
        workingSpace.data());

    if (!err.empty()) {
      PUSH_ERROR("Failed to decode elementTokenIndexes.");
      return false;
    }
  }

  // jumps.
  {
    uint64_t compJumpsSize;
    if (!_sr->read8(&compJumpsSize)) {
      PUSH_ERROR("Failed to read compressed jumpsSize.");
      return false;
    }

    if (compJumpsSize > compBufferSize) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Compressed elementTokenIndexes size.");
    }

    CHECK_MEMORY_USAGE(size_t(compJumpsSize));

    if (compJumpsSize !=
        _sr->read(size_t(compJumpsSize), size_t(compJumpsSize),
                  reinterpret_cast<uint8_t *>(compBuffer.data()))) {
      PUSH_ERROR("Failed to read compressed jumps data.");
      return false;
    }

    std::string err;
    Usd_IntegerCompression::DecompressFromBuffer(
        compBuffer.data(), size_t(compJumpsSize), jumps.data(), size_t(numEncodedPaths),
        &err, workingSpace.data());

    if (!err.empty()) {
      PUSH_ERROR("Failed to decode jumps.");
      return false;
    }
  }

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  for (size_t i = 0; i < pathIndexes.size(); i++) {
    DCOUT("pathIndexes[" << i << "] = " << pathIndexes[i]);
  }

  for (size_t i = 0; i < elementTokenIndexes.size(); i++) {
    std::stringstream ss;
    ss << "elementTokenIndexes[" << i << "] = " << elementTokenIndexes[i];
    int32_t tokIdx = elementTokenIndexes[i];
    if (tokIdx < 0) {
      // Property Path. Need to negate it.
      tokIdx = -tokIdx;
    }
    if (auto tokv = GetToken(crate::Index(uint32_t(tokIdx)))) {
      ss << "(" << tokv.value() << ")";
    }
    ss << "\n";
    DCOUT(ss.str());
  }

  for (size_t i = 0; i < jumps.size(); i++) {
    DCOUT(fmt::format("jumps[{}] = {}", i, jumps[i]));
  }
#endif

  // For circular tree check
  std::vector<bool> visit_table;
  CHECK_MEMORY_USAGE(_paths.size()); // TODO: divide by 8?

  // `_paths` is already initialized just before calling this ReadCompressedPaths
  visit_table.resize(_paths.size());
  for (size_t i = 0; i < visit_table.size(); i++) {
    visit_table[i] = false;
  }

  // Now build the paths.
#if defined(TINYUSDZ_CRATE_USE_FOR_BASED_PATH_INDEX_DECODER)
  BuildDecompressedPathsArg arg;
  arg.pathIndexes = &pathIndexes;
  arg.elementTokenIndexes = &elementTokenIndexes;
  arg.jumps = &jumps;
  arg.visit_table = &visit_table;
  arg.startIndex = 0;
  arg.endIndex = pathIndexes.size() - 1; // or numEncodedPaths - 1
  arg.parentPath = Path();
  if (!BuildDecompressedPathsImpl(&arg)) {
    return false;
  }

#else
  if (!BuildDecompressedPathsImpl(pathIndexes, elementTokenIndexes, jumps, visit_table,
                                  /* curIndex */ 0, Path())) {
    return false;
  }
#endif

  //
  // Ensure decoded numEncodedPaths.
  //
  size_t sumDecodedPaths = 0;
  for (size_t i = 0; i < visit_table.size(); i++) {
    if (visit_table[i]) {
      sumDecodedPaths++;
    }
  }
  if (sumDecodedPaths != numEncodedPaths) {
    PUSH_ERROR_AND_RETURN(fmt::format("Decoded {} paths but numEncodedPaths in Crate is {}. Possible corruption of Crate data.",
      sumDecodedPaths, numEncodedPaths));
  }

  // Now build node hierarchy.

  // Circular referencing check should be done in BuildDecompressedPathsImpl,
  // but do check it again just in case.
  for (size_t i = 0; i < visit_table.size(); i++) {
    visit_table[i] = false;
  }
  if (!BuildNodeHierarchy(pathIndexes, elementTokenIndexes, jumps, visit_table,
                          /* curIndex */ 0, /* parent node index */ -1)) {
    return false;
  }

  sumDecodedPaths = 0;
  for (size_t i = 0; i < visit_table.size(); i++) {
    if (visit_table[i]) {
      sumDecodedPaths++;
    }
  }
  if (sumDecodedPaths != numEncodedPaths) {
    PUSH_ERROR_AND_RETURN(fmt::format("Decoded {} paths but numEncodedPaths in BuildNodeHierarchy is {}. Possible corruption of Crate data.",
      sumDecodedPaths, numEncodedPaths));
  }

  return true;
}